

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_widget.c
# Opt level: O0

void ugui_menu_widget_basic_event_handler(ugui_window_t *window,int event,void *ctx)

{
  int iVar1;
  int max_rows;
  ugui_menu_widget_t *menu_widget;
  void *ctx_local;
  int event_local;
  ugui_window_t *window_local;
  
  iVar1 = (**(code **)((long)ctx + 0x30))(ctx,0);
  if (event == 1) {
    if (*(int *)((long)ctx + 0x50) != 0) {
      *(int *)((long)ctx + 0x50) = *(int *)((long)ctx + 0x50) + -1;
    }
  }
  else if (event == 2) {
    if (*(uint *)((long)ctx + 0x50) < iVar1 - 1U) {
      *(int *)((long)ctx + 0x50) = *(int *)((long)ctx + 0x50) + 1;
    }
  }
  else if ((event - 4U < 2) && (*(long *)((long)ctx + 0x48) != 0)) {
    (**(code **)((long)ctx + 0x48))
              (ctx,(short)*(undefined4 *)((long)ctx + 0x50),0,*(undefined4 *)((long)ctx + 0x50));
  }
  return;
}

Assistant:

static void ugui_menu_widget_basic_event_handler(ugui_window_t *window, int event, void* ctx) {
	ugui_menu_widget_t* menu_widget = (ugui_menu_widget_t*)ctx;

	int max_rows = menu_widget->data_callbacks.get_num_rows(menu_widget, NULL);

	switch (event) {
	case UGUI_EVT_UP:
		if (menu_widget->selected > 0) menu_widget->selected --;
		break;
	case UGUI_EVT_DOWN:
		if (menu_widget->selected < (max_rows - 1)) menu_widget->selected ++;
		break;
	case UGUI_EVT_RIGHT:
	case UGUI_EVT_SELECT:
		//TODO: select callback
		if(menu_widget->data_callbacks.select != NULL) {
			menu_widget->data_callbacks.select(menu_widget, menu_widget->selected, NULL);
		}
		break;
	}
}